

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O2

stbtt__buf stbtt__get_subrs(stbtt__buf cff,stbtt__buf fontdict)

{
  stbtt_uint32 sVar1;
  stbtt__buf sVar2;
  stbtt_uint32 subrsoff;
  stbtt__buf cff_local;
  stbtt_uint32 private_loc [2];
  stbtt__buf local_30;
  stbtt__buf fontdict_local;
  
  cff_local._8_8_ = cff._8_8_;
  cff_local.data = cff.data;
  fontdict_local._8_8_ = fontdict._8_8_;
  fontdict_local.data = fontdict.data;
  subrsoff = 0;
  private_loc[0] = 0;
  private_loc[1] = 0;
  stbtt__dict_get_ints(&fontdict_local,0x12,2,private_loc);
  sVar1 = private_loc[1];
  sVar2 = (stbtt__buf)ZEXT816(0);
  if (private_loc[0] != 0 && private_loc[1] != 0) {
    local_30 = stbtt__buf_range(&cff_local,private_loc[1],private_loc[0]);
    stbtt__dict_get_ints(&local_30,0x13,1,&subrsoff);
    if (subrsoff == 0) {
      sVar2 = (stbtt__buf)ZEXT816(0);
    }
    else {
      stbtt__buf_seek(&cff_local,subrsoff + sVar1);
      sVar2 = stbtt__cff_get_index(&cff_local);
    }
  }
  return sVar2;
}

Assistant:

static stbtt__buf stbtt__get_subrs(stbtt__buf cff, stbtt__buf fontdict)
{
   stbtt_uint32 subrsoff = 0, private_loc[2] = { 0, 0 };
   stbtt__buf pdict;
   stbtt__dict_get_ints(&fontdict, 18, 2, private_loc);
   if (!private_loc[1] || !private_loc[0]) return stbtt__new_buf(NULL, 0);
   pdict = stbtt__buf_range(&cff, private_loc[1], private_loc[0]);
   stbtt__dict_get_ints(&pdict, 19, 1, &subrsoff);
   if (!subrsoff) return stbtt__new_buf(NULL, 0);
   stbtt__buf_seek(&cff, private_loc[1]+subrsoff);
   return stbtt__cff_get_index(&cff);
}